

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

void __thiscall tinyxml2::XMLNode::Unlink(XMLNode *this,XMLNode *child)

{
  XMLNode *pXVar1;
  XMLNode *pXVar2;
  
  if (this->_firstChild == child) {
    this->_firstChild = this->_firstChild->_next;
  }
  if (this->_lastChild == child) {
    this->_lastChild = this->_lastChild->_prev;
  }
  pXVar1 = child->_prev;
  pXVar2 = child->_next;
  if (pXVar1 != (XMLNode *)0x0) {
    pXVar1->_next = pXVar2;
  }
  if (pXVar2 != (XMLNode *)0x0) {
    pXVar2->_prev = pXVar1;
  }
  child->_parent = (XMLNode *)0x0;
  child->_prev = (XMLNode *)0x0;
  child->_next = (XMLNode *)0x0;
  return;
}

Assistant:

void XMLNode::Unlink( XMLNode* child )
{
    TIXMLASSERT( child );
    TIXMLASSERT( child->_document == _document );
    TIXMLASSERT( child->_parent == this );
    if ( child == _firstChild ) {
        _firstChild = _firstChild->_next;
    }
    if ( child == _lastChild ) {
        _lastChild = _lastChild->_prev;
    }

    if ( child->_prev ) {
        child->_prev->_next = child->_next;
    }
    if ( child->_next ) {
        child->_next->_prev = child->_prev;
    }
	child->_next = 0;
	child->_prev = 0;
	child->_parent = 0;
}